

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O2

bool __thiscall CBlockPolicyEstimator::Write(CBlockPolicyEstimator *this,AutoFile *fileout)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  AutoFile *this_00;
  uint *obj;
  long in_FS_OFFSET;
  Wrapper<VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter>,_const_std::vector<double,_std::allocator<double>_>_&>
  local_40;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock6,&this->m_cs_fee_estimator,"m_cs_fee_estimator",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/policy/fees.cpp"
             ,0x3c3,false);
  ser_writedata32<AutoFile>(fileout,0x2498c);
  AutoFile::operator<<(fileout,&CLIENT_VERSION);
  obj = &this->nBestSeenHeight;
  AutoFile::operator<<(fileout,obj);
  uVar2 = BlockSpan(this);
  uVar3 = HistoricalBlockSpan(this);
  if (uVar3 >> 1 < uVar2) {
    this_00 = AutoFile::operator<<(fileout,&this->firstRecordedHeight);
  }
  else {
    this_00 = AutoFile::operator<<(fileout,&this->historicalFirst);
    obj = &this->historicalBest;
  }
  AutoFile::operator<<(this_00,obj);
  local_40.m_object = &this->buckets;
  AutoFile::operator<<(fileout,&local_40);
  TxConfirmStats::Write
            ((this->feeStats)._M_t.
             super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
             super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
             super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl,fileout);
  TxConfirmStats::Write
            ((this->shortStats)._M_t.
             super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
             super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
             super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl,fileout);
  TxConfirmStats::Write
            ((this->longStats)._M_t.
             super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
             super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
             super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl,fileout);
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock6.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool CBlockPolicyEstimator::Write(AutoFile& fileout) const
{
    try {
        LOCK(m_cs_fee_estimator);
        fileout << 149900; // version required to read: 0.14.99 or later
        fileout << CLIENT_VERSION; // version that wrote the file
        fileout << nBestSeenHeight;
        if (BlockSpan() > HistoricalBlockSpan()/2) {
            fileout << firstRecordedHeight << nBestSeenHeight;
        }
        else {
            fileout << historicalFirst << historicalBest;
        }
        fileout << Using<VectorFormatter<EncodedDoubleFormatter>>(buckets);
        feeStats->Write(fileout);
        shortStats->Write(fileout);
        longStats->Write(fileout);
    }
    catch (const std::exception&) {
        LogPrintf("CBlockPolicyEstimator::Write(): unable to write policy estimator data (non-fatal)\n");
        return false;
    }
    return true;
}